

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sljitNativeX86_64.c
# Opt level: O0

sljit_s32 sljit_emit_fast_enter(sljit_compiler *compiler,sljit_s32 dst,sljit_sw dstw)

{
  undefined1 *puVar1;
  sljit_u8 *psVar2;
  sljit_u8 *inst;
  sljit_sw dstw_local;
  sljit_s32 dst_local;
  sljit_compiler *compiler_local;
  
  if (compiler->error == 0) {
    dstw_local._4_4_ = dst;
    if (dst == 0) {
      dstw_local._4_4_ = 0xf;
    }
    if (dstw_local._4_4_ < 0x40) {
      if (""[dstw_local._4_4_] < 8) {
        puVar1 = (undefined1 *)ensure_buf(compiler,2);
        if (puVar1 == (undefined1 *)0x0) {
          compiler_local._4_4_ = compiler->error;
        }
        else {
          *puVar1 = 1;
          compiler->size = compiler->size + 1;
          puVar1[1] = ""[dstw_local._4_4_] + 'X';
          compiler_local._4_4_ = 0;
        }
      }
      else {
        puVar1 = (undefined1 *)ensure_buf(compiler,3);
        if (puVar1 == (undefined1 *)0x0) {
          compiler_local._4_4_ = compiler->error;
        }
        else {
          *puVar1 = 2;
          compiler->size = compiler->size + 2;
          puVar1[1] = 0x41;
          puVar1[2] = ""[dstw_local._4_4_] + 'X';
          compiler_local._4_4_ = 0;
        }
      }
    }
    else {
      compiler->mode32 = 1;
      psVar2 = emit_x86_instruction(compiler,1,0,0,dstw_local._4_4_,dstw);
      if (psVar2 == (sljit_u8 *)0x0) {
        compiler_local._4_4_ = compiler->error;
      }
      else {
        *psVar2 = 0x8f;
        compiler_local._4_4_ = 0;
      }
    }
  }
  else {
    compiler_local._4_4_ = compiler->error;
  }
  return compiler_local._4_4_;
}

Assistant:

SLJIT_API_FUNC_ATTRIBUTE sljit_s32 sljit_emit_fast_enter(struct sljit_compiler *compiler, sljit_s32 dst, sljit_sw dstw)
{
	sljit_u8 *inst;

	CHECK_ERROR();
	CHECK(check_sljit_emit_fast_enter(compiler, dst, dstw));
	ADJUST_LOCAL_OFFSET(dst, dstw);

	/* For UNUSED dst. Uncommon, but possible. */
	if (dst == SLJIT_UNUSED)
		dst = TMP_REG1;

	if (FAST_IS_REG(dst)) {
		if (reg_map[dst] < 8) {
			inst = (sljit_u8*)ensure_buf(compiler, 1 + 1);
			FAIL_IF(!inst);
			INC_SIZE(1);
			POP_REG(reg_lmap[dst]);
			return SLJIT_SUCCESS;
		}

		inst = (sljit_u8*)ensure_buf(compiler, 1 + 2);
		FAIL_IF(!inst);
		INC_SIZE(2);
		*inst++ = REX_B;
		POP_REG(reg_lmap[dst]);
		return SLJIT_SUCCESS;
	}

	/* REX_W is not necessary (src is not immediate). */
	compiler->mode32 = 1;
	inst = emit_x86_instruction(compiler, 1, 0, 0, dst, dstw);
	FAIL_IF(!inst);
	*inst++ = POP_rm;
	return SLJIT_SUCCESS;
}